

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

void parse(t_program *program,t_program *parent_program)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  char *fmt;
  pointer pptVar5;
  string path;
  char *local_90;
  long local_88;
  char local_80 [16];
  string local_70;
  string local_50;
  
  local_90 = local_80;
  pcVar2 = (program->path_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + (program->path_)._M_string_length);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_90,local_90 + local_88);
  directory_name(&local_70,&local_50);
  std::__cxx11::string::operator=((string *)&g_curdir_abi_cxx11_,(string *)&local_70);
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::__cxx11::string::_M_assign((string *)&g_curpath_abi_cxx11_);
  yyin = (FILE *)fopen(local_90,"r");
  if ((FILE *)yyin != (FILE *)0x0) {
    bVar3 = skip_utf8_bom(yyin);
    if (bVar3) {
      pverbose("Skipped UTF-8 BOM at %s\n",local_90);
    }
    pverbose("Scanning %s for includes\n",local_90);
    g_parse_mode = INCLUDES;
    g_scope = program->scope_;
    yylineno = 1;
    g_program = program;
    iVar4 = yyparse();
    if (iVar4 == 0) {
      fclose((FILE *)yyin);
      for (pptVar5 = (program->includes_).
                     super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pptVar5 !=
          (program->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl
          .super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
        parse(*pptVar5,program);
      }
      reset_program_doctext_info();
      g_parse_mode = PROGRAM;
      g_scope = program->scope_;
      if (parent_program == (t_program *)0x0) {
        g_parent_scope = (t_scope *)0x0;
      }
      else {
        g_parent_scope = parent_program->scope_;
      }
      pcVar2 = (program->name_)._M_dataplus._M_p;
      g_program = program;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + (program->name_)._M_string_length);
      std::__cxx11::string::append((char *)&local_70);
      std::__cxx11::string::operator=((string *)&g_parent_prefix_abi_cxx11_,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      std::__cxx11::string::_M_assign((string *)&g_curpath_abi_cxx11_);
      yyin = (FILE *)fopen(local_90,"r");
      if ((FILE *)yyin == (FILE *)0x0) goto LAB_0012930f;
      bVar3 = skip_utf8_bom(yyin);
      if (bVar3) {
        pverbose("Skipped UTF-8 BOM at %s\n",local_90);
      }
      pverbose("Parsing %s for types\n",local_90);
      yylineno = 1;
      iVar4 = yyparse();
      if (iVar4 == 0) {
        fclose((FILE *)yyin);
        if (local_90 != local_80) {
          operator_delete(local_90);
        }
        return;
      }
      fmt = "Parser error during types pass.";
    }
    else {
      fmt = "Parser error during include pass.";
    }
    failure(fmt);
  }
LAB_0012930f:
  failure("Could not open input file: \"%s\"",local_90);
}

Assistant:

void parse(t_program *program, t_program *parent_program) {
    // Get scope file path
    string path = program->get_path();

    // Set current dir global, which is used in the include_file function
    g_curdir = directory_name(path);
    g_curpath = path;

    // Open the file
    // skip UTF-8 BOM if there is one
    yyin = fopen(path.c_str(), "r");
    if (yyin == 0) {
        failure("Could not open input file: \"%s\"", path.c_str());
    }
    if (skip_utf8_bom(yyin))
        pverbose("Skipped UTF-8 BOM at %s\n", path.c_str());

    // Create new scope and scan for includes
    pverbose("Scanning %s for includes\n", path.c_str());
    g_parse_mode = INCLUDES;
    g_program = program;
    g_scope = program->scope();
    try {
        yylineno = 1;
        if (yyparse() != 0) {
            failure("Parser error during include pass.");
        }
    } catch (string &x) {
        failure(x.c_str());
    }
    fclose(yyin);

    // Recursively parse all the include programs
    vector<t_program *> &includes = program->get_includes();
    vector<t_program *>::iterator iter;
    for (iter = includes.begin(); iter != includes.end(); ++iter) {
        parse(*iter, program);
    }

    // reset program doctext status before parsing a new file
    reset_program_doctext_info();

    // Parse the program file
    g_parse_mode = PROGRAM;
    g_program = program;
    g_scope = program->scope();
    g_parent_scope = (parent_program != nullptr) ? parent_program->scope() : nullptr;
    g_parent_prefix = program->get_name() + ".";
    g_curpath = path;

    // Open the file
    // skip UTF-8 BOM if there is one
    yyin = fopen(path.c_str(), "r");
    if (yyin == 0) {
        failure("Could not open input file: \"%s\"", path.c_str());
    }
    if (skip_utf8_bom(yyin))
        pverbose("Skipped UTF-8 BOM at %s\n", path.c_str());

    pverbose("Parsing %s for types\n", path.c_str());
    yylineno = 1;
    try {
        if (yyparse() != 0) {
            failure("Parser error during types pass.");
        }
    } catch (string &x) {
        failure(x.c_str());
    }
    fclose(yyin);
}